

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

Test * __thiscall
testing::internal::TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test>::
CreateTest(TestFactoryImpl<(anonymous_namespace)::ktxTexture1WriteKTX2TestRGB8_3D_Test> *this)

{
  uint32_t uVar1;
  ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U> *this_00;
  
  this_00 = (ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U> *)operator_new(0x188);
  anon_unknown.dwarf_bea9::ktxTexture1WriteTestBase<unsigned_char,_3U,_32849U>::
  ktxTexture1WriteTestBase(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0019d288;
  uVar1 = anon_unknown.dwarf_bea9::gcd(3,4);
  *(int *)&this_00[1].super_Test._vptr_Test = (int)(0xc / (ulong)uVar1);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__ktxTexture1WriteTestBase_0019d8f8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }